

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManSortPairsInt(word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
                        Vec_Int_t *vUnatePairsW,Vec_Wec_t *vSorter)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  Vec_Int_t *p;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  Vec_WecInit(vSorter,nWords << 6);
  iVar9 = 0;
  if (nWords < 1) {
    nWords = 0;
  }
  uVar10 = (ulong)(uint)nWords;
  do {
    if (vUnatePairs->nSize <= iVar9) {
      vUnatePairs->nSize = 0;
      vUnatePairsW->nSize = 0;
      iVar9 = vSorter->nSize;
      while (0 < iVar9) {
        iVar9 = iVar9 + -1;
        p = Vec_WecEntry(vSorter,iVar9);
        for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(p,iVar1);
          Vec_IntPush(vUnatePairs,iVar2);
          Vec_IntPush(vUnatePairsW,iVar9);
        }
      }
      Vec_WecClear(vSorter);
      return;
    }
    iVar1 = Vec_IntEntry(vUnatePairs,iVar9);
    iVar2 = Abc_LitIsCompl(iVar1);
    uVar3 = Abc_Lit2Var(iVar1);
    uVar3 = uVar3 & 0x7fff;
    uVar4 = Abc_Lit2Var(iVar1);
    uVar4 = uVar4 >> 0xf;
    iVar5 = Abc_Lit2Var(uVar3);
    pvVar7 = Vec_PtrEntry(vDivs,iVar5);
    iVar5 = Abc_Lit2Var(uVar4);
    pvVar8 = Vec_PtrEntry(vDivs,iVar5);
    if (uVar3 < uVar4) {
      if (iVar2 != 0) {
        __assert_fail("!fComp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                      ,0x3ed,
                      "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      iVar5 = Abc_LitIsCompl(uVar3);
      iVar6 = Abc_LitIsCompl(uVar4);
      if (iVar6 == 0 && iVar5 == 0) {
        iVar2 = 0;
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          iVar5 = Abc_TtCountOnes(*(ulong *)((long)pvVar7 + uVar11 * 8) & pOn[uVar11] &
                                  *(ulong *)((long)pvVar8 + uVar11 * 8));
          iVar2 = iVar2 + iVar5;
        }
      }
      else if (iVar5 == 0 || (byte)iVar6 != 0) {
        uVar11 = 0;
        iVar2 = 0;
        if ((iVar5 == 0 & (byte)iVar6) == 0) {
          for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            iVar5 = Abc_TtCountOnes(~(*(ulong *)((long)pvVar8 + uVar11 * 8) |
                                     *(ulong *)((long)pvVar7 + uVar11 * 8)) & pOn[uVar11]);
            iVar2 = iVar2 + iVar5;
          }
        }
        else {
          for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            iVar5 = Abc_TtCountOnes(~*(ulong *)((long)pvVar8 + uVar11 * 8) &
                                    *(ulong *)((long)pvVar7 + uVar11 * 8) & pOn[uVar11]);
            iVar2 = iVar2 + iVar5;
          }
        }
      }
      else {
        iVar2 = 0;
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          iVar5 = Abc_TtCountOnes(~*(ulong *)((long)pvVar7 + uVar11 * 8) & pOn[uVar11] &
                                  *(ulong *)((long)pvVar8 + uVar11 * 8));
          iVar2 = iVar2 + iVar5;
        }
      }
    }
    else {
      iVar5 = Abc_LitIsCompl(uVar3);
      if (iVar5 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                      ,0x3f3,
                      "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      iVar5 = Abc_LitIsCompl(uVar4);
      if (iVar5 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                      ,0x3f4,
                      "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      if (iVar2 == 0) {
        iVar2 = 0;
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          iVar5 = Abc_TtCountOnes((*(ulong *)((long)pvVar8 + uVar11 * 8) ^
                                  *(ulong *)((long)pvVar7 + uVar11 * 8)) & pOn[uVar11]);
          iVar2 = iVar2 + iVar5;
        }
      }
      else {
        iVar2 = 0;
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          iVar5 = Abc_TtCountOnes(~(*(ulong *)((long)pvVar7 + uVar11 * 8) ^
                                   *(ulong *)((long)pvVar8 + uVar11 * 8)) & pOn[uVar11]);
          iVar2 = iVar2 + iVar5;
        }
      }
    }
    Vec_WecPush(vSorter,iVar2,iVar1);
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void Gia_ManSortPairsInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, Vec_Wec_t * vSorter )
{
    int i, k, iPair;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnatePairs, iPair, i )
    {
        int fComp = Abc_LitIsCompl(iPair);
        int iLit0 = Abc_Lit2Var(iPair) & 0x7FFF;
        int iLit1 = Abc_Lit2Var(iPair) >> 15;
        word * pDiv0 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit0) );
        word * pDiv1 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit1) );
        if ( iLit0 < iLit1 )
        {
            assert( !fComp );
            //assert( !Abc_TtIntersectTwo( pOff, 0, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecMask2(pDiv0, pDiv1, Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1), pOn, nWords), iPair );
        }
        else
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            //assert( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, fComp, nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecXorMask(pDiv0, pDiv1, fComp, pOn, nWords), iPair );
        }
    }
    Vec_IntClear( vUnatePairs );
    Vec_IntClear( vUnatePairsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iPair, i )
        {
            Vec_IntPush( vUnatePairs, iPair );
            Vec_IntPush( vUnatePairsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );

}